

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O2

ostream * termcolor::grey(ostream *stream)

{
  bool bVar1;
  
  bVar1 = _internal::is_colorized(stream);
  if (bVar1) {
    std::operator<<(stream,"\x1b[30m");
  }
  return stream;
}

Assistant:

inline std::ostream &grey(std::ostream &stream) {
	if (_internal::is_colorized(stream)) {
#if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
		stream << "\033[30m";
#elif defined(TERMCOLOR_OS_WINDOWS)
		_internal::win_change_attributes(stream,
		                                 0 // grey (black)
		);
#endif
	}
	return stream;
}